

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Index __thiscall wabt::anon_unknown_1::WatWriter::GetLabelArity(WatWriter *this,Var *var)

{
  TypeVector *pTVar1;
  TypeVector *pTVar2;
  __type _Var3;
  ulong uVar4;
  string *__rhs;
  char *pcVar5;
  long lVar6;
  int in_EDX;
  pointer pLVar7;
  long lVar8;
  uint uVar9;
  
  if (var->type_ == Name) {
    uVar4 = ((long)(this->label_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x58 & 0xffffffff;
    lVar8 = uVar4 * -0x58;
    lVar6 = uVar4 * 0x58;
    do {
      lVar8 = lVar8 + 0x58;
      if (lVar8 == 0x58) {
        return 0;
      }
      pLVar7 = (this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs = Var::name_abi_cxx11_(var);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pLVar7[-1].name._M_dataplus._M_p + lVar6),__rhs);
      lVar6 = lVar6 + -0x58;
    } while (!_Var3);
    pLVar7 = (pointer)((long)pLVar7 - lVar8);
  }
  else {
    pcVar5 = Var::index(var,(char *)var,in_EDX);
    lVar6 = (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (uint)(lVar6 / 0x58);
    if (uVar9 <= (uint)pcVar5) {
      return 0;
    }
    pcVar5 = Var::index(var,(char *)0x58,(int)(lVar6 % 0x58));
    pLVar7 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start + (~(uint)pcVar5 + uVar9);
  }
  if (pLVar7 == (pointer)0x0) {
    return 0;
  }
  pTVar1 = &pLVar7->param_types;
  pTVar2 = &pLVar7->param_types;
  if (pLVar7->label_type != Loop) {
    pTVar1 = &pLVar7->result_types;
    pTVar2 = &pLVar7->result_types;
  }
  return (Index)((ulong)((long)*(pointer *)
                                ((long)&pTVar2->
                                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                + 8) -
                        *(long *)&(pTVar1->
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                  _M_impl.super__Vector_impl_data) >> 2);
}

Assistant:

Index WatWriter::GetLabelArity(const Var& var) {
  Label* label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}